

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_rename.cpp
# Opt level: O2

unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true> __thiscall
duckdb::Transformer::TransformRename(Transformer *this,PGRenameStmt *stmt)

{
  int iVar1;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var2;
  reference args_1;
  pointer pAVar3;
  NotImplementedException *pNVar4;
  long in_RDX;
  Transformer *this_00;
  AlterInfo *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  string new_name;
  AlterEntryData data;
  
  if (*(long *)(in_RDX + 0x10) == 0) {
    pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&data,"Altering schemas is not yet supported",(allocator *)&new_name);
    NotImplementedException::NotImplementedException(pNVar4,(string *)&data);
    __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  data.catalog._M_dataplus._M_p = (pointer)&data.catalog.field_2;
  data.catalog._M_string_length = 0;
  data.catalog.field_2._M_local_buf[0] = '\0';
  data.schema._M_dataplus._M_p = (pointer)&data.schema.field_2;
  data.schema._M_string_length = 0;
  data.schema.field_2._M_local_buf[0] = '\0';
  data.name._M_dataplus._M_p = (pointer)&data.name.field_2;
  data.name._M_string_length = 0;
  data.name.field_2._M_local_buf[0] = '\0';
  data.if_not_found = *(OnEntryNotFound *)(in_RDX + 0x3c);
  ::std::__cxx11::string::assign((char *)&data);
  ::std::__cxx11::string::assign((char *)&data.schema);
  this_00 = *(Transformer **)(*(long *)(in_RDX + 0x10) + 0x18);
  if (this_00 != (Transformer *)0x0) {
    ::std::__cxx11::string::assign((char *)&data.name);
  }
  iVar1 = *(int *)(in_RDX + 4);
  if (iVar1 == 0x30) {
    ::std::__cxx11::string::string
              ((string *)&new_name,*(char **)(in_RDX + 0x30),(allocator *)&names);
    make_uniq<duckdb::RenameViewInfo,duckdb::AlterEntryData,std::__cxx11::string&>
              ((duckdb *)&names,&data,&new_name);
  }
  else {
    if (iVar1 != 0x26) {
      if (iVar1 != 6) {
        pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&new_name,"Schema element not supported yet!",(allocator *)&names);
        NotImplementedException::NotImplementedException(pNVar4,(string *)&new_name);
        __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      TransformNameList_abi_cxx11_(&names,this_00,*(PGList **)(in_RDX + 0x28));
      ::std::__cxx11::string::string
                ((string *)&new_name,*(char **)(in_RDX + 0x30),(allocator *)&local_d0);
      if ((long)names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        args_1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&names,0);
        make_uniq<duckdb::RenameColumnInfo,duckdb::AlterEntryData,std::__cxx11::string,std::__cxx11::string>
                  ((duckdb *)&local_d0,&data,args_1,&new_name);
      }
      else {
        make_uniq<duckdb::RenameFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>,std::__cxx11::string>
                  ((duckdb *)&local_d0,&data,&names,&new_name);
      }
      ::std::__cxx11::string::~string((string *)&new_name);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&names);
      goto LAB_01363eeb;
    }
    ::std::__cxx11::string::string
              ((string *)&new_name,*(char **)(in_RDX + 0x30),(allocator *)&names);
    make_uniq<duckdb::RenameTableInfo,duckdb::AlterEntryData,std::__cxx11::string&>
              ((duckdb *)&names,&data,&new_name);
  }
  ::std::__cxx11::string::~string((string *)&new_name);
  local_d0 = (AlterInfo *)
             names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_01363eeb:
  make_uniq<duckdb::AlterStatement>();
  pAVar3 = unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>::
           operator->((unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>,_true>
                       *)this);
  _Var2._M_head_impl =
       (pAVar3->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
       super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
  (pAVar3->info).super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
  super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = local_d0;
  if (_Var2._M_head_impl != (AlterInfo *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
  }
  AlterEntryData::~AlterEntryData(&data);
  return (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)
         (unique_ptr<duckdb::AlterStatement,_std::default_delete<duckdb::AlterStatement>_>)this;
}

Assistant:

unique_ptr<AlterStatement> Transformer::TransformRename(duckdb_libpgquery::PGRenameStmt &stmt) {
	if (!stmt.relation) {
		throw NotImplementedException("Altering schemas is not yet supported");
	}

	unique_ptr<AlterInfo> info;

	AlterEntryData data;
	data.if_not_found = TransformOnEntryNotFound(stmt.missing_ok);
	data.catalog = stmt.relation->catalogname ? stmt.relation->catalogname : INVALID_CATALOG;
	data.schema = stmt.relation->schemaname ? stmt.relation->schemaname : INVALID_SCHEMA;
	if (stmt.relation->relname) {
		data.name = stmt.relation->relname;
	}
	// first we check the type of ALTER
	switch (stmt.renameType) {
	case duckdb_libpgquery::PG_OBJECT_COLUMN: {
		// change column name

		// get the old name and the new name
		auto names = TransformNameList(*stmt.name_list);
		string new_name = stmt.newname;
		if (names.size() == 1) {
			info = make_uniq<RenameColumnInfo>(std::move(data), std::move(names[0]), std::move(new_name));
		} else {
			info = make_uniq<RenameFieldInfo>(std::move(data), std::move(names), std::move(new_name));
		}
		break;
	}
	case duckdb_libpgquery::PG_OBJECT_TABLE: {
		// change table name
		string new_name = stmt.newname;
		info = make_uniq<RenameTableInfo>(std::move(data), new_name);
		break;
	}
	case duckdb_libpgquery::PG_OBJECT_VIEW: {
		// change view name
		string new_name = stmt.newname;
		info = make_uniq<RenameViewInfo>(std::move(data), new_name);
		break;
	}
	case duckdb_libpgquery::PG_OBJECT_DATABASE:
	default:
		throw NotImplementedException("Schema element not supported yet!");
	}
	D_ASSERT(info);

	auto result = make_uniq<AlterStatement>();
	result->info = std::move(info);
	return result;
}